

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  qpTestLog *pqVar3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar10;
  pointer pcVar11;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar12;
  double dVar13;
  undefined8 uVar14;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *pBVar15;
  pointer pMVar16;
  int iVar17;
  _Rb_tree_node_base *p_Var18;
  Interval *pIVar19;
  IVal *pIVar20;
  MessageBuilder *pMVar21;
  undefined8 *puVar22;
  uint uVar23;
  undefined1 *puVar24;
  int row;
  long lVar25;
  long lVar26;
  char *pcVar27;
  qpTestLog *pqVar28;
  TestLog TVar29;
  TestLog *pTVar30;
  long lVar31;
  FloatFormat *pFVar32;
  bool bVar33;
  IVal reference1;
  IVal in2;
  IVal in3;
  FuncSet funcs;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  void *outputArr [2];
  IVal in0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FloatFormat highpFmt;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa58;
  IVal local_5a1;
  string local_5a0;
  TestLog *local_580;
  size_t local_578;
  IVal *local_570;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *local_568;
  TestStatus *local_560;
  FloatFormat *local_558;
  string local_550;
  long local_530;
  undefined1 local_528 [16];
  TestLog local_518;
  _Rb_tree_node_base *local_510;
  _Rb_tree_node_base *local_508;
  double local_500;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  local_468;
  pointer local_438;
  pointer local_430;
  undefined1 local_428 [20];
  YesNoMaybe YStack_414;
  Interval IStack_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3f8;
  Interval local_3f0 [2];
  ios_base local_3b8 [8];
  ios_base local_3b0 [264];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2a8;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  FloatFormat local_228;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar32 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_560 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_558 = pFVar32;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,3,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2a8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar32,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffffa58);
  pMVar16 = local_2a8.in0.
            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_578 = ((long)local_2a8.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2a8.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_578);
  local_228.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_228.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_228.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_228.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_228.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_228.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_228.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_228.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_228._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_580 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_248 = local_2a8.in0.
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_240 = local_2a8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_238 = local_2a8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = local_2a8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_438 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_430 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_428 + 8);
  local_428._0_8_ = local_580;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_528 + 8);
  local_528._8_4_ = _S_red;
  local_518.m_log = (qpTestLog *)0x0;
  local_500 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_510 = p_Var5;
  local_508 = p_Var5;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_528);
  if (local_510 != p_Var5) {
    p_Var18 = local_510;
    do {
      (**(code **)(**(long **)(p_Var18 + 1) + 0x30))(*(long **)(p_Var18 + 1),local_1a8);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != p_Var5);
  }
  if (local_500 != 0.0) {
    poVar4 = (ostringstream *)(local_428 + 8);
    local_428._0_8_ = local_580;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3b0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_528);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar20 = (IVal *)&local_438;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_578,&local_248,pIVar20,0);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_428);
  pFVar32 = local_558;
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr,
             (IVal *)local_428);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5a0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_550);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_5a1);
  if (local_2a8.in0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar16) {
    local_570 = (IVal *)0x0;
  }
  else {
    local_530 = local_578 + (local_578 == 0);
    lVar31 = 0;
    local_570 = (IVal *)0x0;
    local_568 = this;
    do {
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      round<tcu::Matrix<float,3,2>>
                ((IVal *)local_528,(shaderexecutor *)pFVar32,
                 (FloatFormat *)
                 (local_2a8.in0.
                  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar31),(Matrix<float,_3,_2> *)pIVar20
                );
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_428,pFVar32,(IVal *)local_528);
      pIVar19 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_498,
                           (local_568->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      pBVar15 = local_568;
      lVar25 = 0;
      pMVar21 = (MessageBuilder *)local_428;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)&pIVar19->m_hi + lVar26) =
               *(undefined8 *)(&pMVar21->field_0x10 + lVar26);
          puVar22 = (undefined8 *)((long)&pMVar21->m_log + lVar26);
          dVar13 = (double)puVar22[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)&pIVar19->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          *(undefined8 *)pbVar2 = *puVar22;
          *(double *)(pbVar2 + 8) = dVar13;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 == 0x48);
        lVar25 = lVar25 + 1;
        pIVar19 = pIVar19 + 1;
        pMVar21 = (MessageBuilder *)&pMVar21->field_0x18;
      } while (lVar25 != 3);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (local_568->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar15->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar15->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_410.m_hi._0_4_ = (pBVar15->m_caseCtx).precision;
      IStack_410.m_lo = pFVar32->m_maxValue;
      local_428._0_8_ = *(undefined8 *)pFVar32;
      local_428._8_4_ = pFVar32->m_fractionBits;
      local_428._12_4_ = pFVar32->m_hasSubnormal;
      local_428._16_4_ = pFVar32->m_hasInf;
      YStack_414 = pFVar32->m_hasNaN;
      IStack_410.m_hasNaN = pFVar32->m_exactPrecision;
      IStack_410._1_3_ = *(undefined3 *)&pFVar32->field_0x19;
      IStack_410._4_4_ = *(undefined4 *)&pFVar32->field_0x1c;
      local_3f0[0].m_hasNaN = false;
      local_3f0[0]._1_3_ = 0;
      pSVar8 = (pBVar15->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3f8 = &local_498;
      (*pSVar8->_vptr_Statement[3])(pSVar8,(MessageBuilder *)local_428);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_498,
                           (pBVar15->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_428,&local_228,pIVar20);
      puVar24 = local_1a8;
      poVar4 = (ostringstream *)(local_428 + 8);
      pMVar21 = (MessageBuilder *)local_428;
      lVar25 = 0;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar26 + 0x10) = *(undefined8 *)(&pMVar21->field_0x10 + lVar26);
          puVar22 = (undefined8 *)((long)&pMVar21->m_log + lVar26);
          uVar14 = puVar22[1];
          *(undefined8 *)(puVar24 + lVar26) = *puVar22;
          *(undefined8 *)((long)(puVar24 + lVar26) + 8) = uVar14;
          lVar26 = lVar26 + 0x30;
        } while (lVar26 != 0x90);
        puVar24 = puVar24 + 0x18;
        pMVar21 = (MessageBuilder *)&pMVar21->field_0x18;
        bVar33 = lVar25 == 0;
        lVar25 = lVar25 + 1;
      } while (bVar33);
      bVar33 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar31);
      local_428._0_8_ = local_428 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_428,"Shader output 0 is outside acceptable range","");
      bVar33 = tcu::ResultCollector::check(&local_1f8,bVar33,(string *)local_428);
      if ((TestLog *)local_428._0_8_ != (TestLog *)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,CONCAT44(YStack_414,local_428._16_4_) + 1);
      }
      uVar23 = (int)local_570 + ((byte)~bVar33 & 1);
      pIVar20 = (IVal *)(ulong)uVar23;
      local_570 = pIVar20;
      if ((int)uVar23 < 0x65 && !bVar33) {
        local_428._0_8_ = local_580;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pcVar27 = "Failed";
        if (bVar33) {
          pcVar27 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar27,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (local_568->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_528._0_8_,
                   CONCAT44(local_528._12_4_,local_528._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  (&local_5a0,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar31),
                   (Matrix<float,_3,_2> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)((long)&(local_518.m_log)->flags + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar12 = (local_568->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pcVar11 = (pVVar12->m_name)._M_dataplus._M_p;
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar11,pcVar11 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_528._0_8_,
                   CONCAT44(local_528._12_4_,local_528._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  (&local_5a0,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar31),
                   (Matrix<float,_2,_3> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,3>>
                  (&local_550,(shaderexecutor *)&local_228,(FloatFormat *)local_1a8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_550._M_dataplus._M_p,local_550._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)((long)&(local_518.m_log)->flags + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_3b0);
      }
      lVar31 = lVar31 + 1;
      pFVar32 = local_558;
    } while (lVar31 != local_530);
  }
  iVar17 = (int)local_570;
  if (100 < iVar17) {
    poVar4 = (ostringstream *)(local_428 + 8);
    local_428._0_8_ = local_580;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
    std::ostream::operator<<(poVar4,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3b0);
  }
  poVar4 = (ostringstream *)(local_428 + 8);
  if (iVar17 == 0) {
    local_428._0_8_ = local_580;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_428._0_8_ = local_580;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3b0);
  if (iVar17 == 0) {
    local_428._0_8_ = (TestLog *)(local_428 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Pass","");
    local_560->m_code = QP_TEST_RESULT_PASS;
    (local_560->m_description)._M_dataplus._M_p = (pointer)&(local_560->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560->m_description,local_428._0_8_,
               (long)(qpTestLog **)local_428._0_8_ + CONCAT44(local_428._12_4_,local_428._8_4_));
    if ((TestLog *)local_428._0_8_ == (TestLog *)(local_428 + 0x10)) goto LAB_009ad4d2;
    TVar29.m_log = (qpTestLog *)CONCAT44(YStack_414,local_428._16_4_);
    pTVar30 = (TestLog *)local_428._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
    std::ostream::operator<<(local_428,iVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
    std::ios_base::~ios_base(local_3b8);
    pTVar30 = (TestLog *)(local_428 + 0x10);
    local_428._0_8_ = pTVar30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428," test failed. Check log for the details","");
    pqVar3 = (qpTestLog *)
             (CONCAT44(local_428._12_4_,local_428._8_4_) +
             CONCAT44(local_528._12_4_,local_528._8_4_));
    TVar29.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_528._0_8_ != &local_518) {
      TVar29.m_log = local_518.m_log;
    }
    if (TVar29.m_log < pqVar3) {
      pqVar28 = (qpTestLog *)0xf;
      if ((TestLog *)local_428._0_8_ != pTVar30) {
        pqVar28 = (qpTestLog *)CONCAT44(YStack_414,local_428._16_4_);
      }
      if (pqVar28 < pqVar3) goto LAB_009ad356;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_428,0,(char *)0x0,local_528._0_8_);
    }
    else {
LAB_009ad356:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_528,local_428._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar22 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar22;
    }
    local_1a8._8_8_ = puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_560->m_code = QP_TEST_RESULT_FAIL;
    (local_560->m_description)._M_dataplus._M_p = (pointer)&(local_560->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((TestLog *)local_428._0_8_ != pTVar30) {
      operator_delete((void *)local_428._0_8_,CONCAT44(YStack_414,local_428._16_4_) + 1);
    }
    TVar29.m_log = local_518.m_log;
    pTVar30 = (TestLog *)local_528._0_8_;
    if ((TestLog *)local_528._0_8_ == &local_518) goto LAB_009ad4d2;
  }
  operator_delete(pTVar30,(ulong)((long)&(TVar29.m_log)->flags + 1));
LAB_009ad4d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.in0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_560;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}